

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O3

void __thiscall deqp::gles3::Performance::LoopCase::~LoopCase(LoopCase *this)

{
  pointer pfVar1;
  int iVar2;
  undefined4 extraout_var;
  
  (this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__LoopCase_0214a9b0;
  iVar2 = (*((this->super_ControlStatementCase).super_ShaderPerformanceCase.m_renderCtx)->
            _vptr_RenderContext[3])();
  if (this->m_arrayBuffer != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x438))(1,&this->m_arrayBuffer);
    this->m_arrayBuffer = 0;
  }
  pfVar1 = (this->m_boundArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1,(long)(this->m_boundArray).
                                 super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pfVar1);
  }
  deqp::gls::ShaderPerformanceCase::~ShaderPerformanceCase((ShaderPerformanceCase *)this);
  return;
}

Assistant:

LoopCase::~LoopCase (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if (m_arrayBuffer)
	{
		gl.deleteBuffers(1, &m_arrayBuffer);
		m_arrayBuffer = 0;
	}
}